

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

void GPU_BlitRect(GPU_Image *image,GPU_Rect *src_rect,GPU_Target *target,GPU_Rect *dest_rect)

{
  ulong uVar1;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined8 uVar7;
  undefined1 uVar2;
  undefined3 uVar3;
  
  if (image != (GPU_Image *)0x0) {
    if (src_rect == (GPU_Rect *)0x0) {
      uVar1._0_2_ = image->w;
      uVar1._2_2_ = image->h;
      uVar2 = image->using_virtual_resolution;
      uVar3 = *(undefined3 *)&image->field_0x1d;
      uVar1._4_4_ = CONCAT31(uVar3,uVar2);
      auVar4._8_4_ = 0;
      auVar4._0_8_ = uVar1;
      auVar4._12_2_ = (short)((uint3)uVar3 >> 8);
      auVar5._8_2_ = (short)uVar1._4_4_;
      auVar5._0_8_ = uVar1;
      auVar5._10_4_ = auVar4._10_4_;
      auVar6._6_8_ = 0;
      auVar6._0_6_ = auVar5._8_6_;
      uVar7 = CONCAT44((float)(int)CONCAT82(SUB148(auVar6 << 0x40,6),uVar1._2_2_),
                       (float)(ushort)(undefined2)uVar1);
    }
    else {
      uVar7._0_4_ = src_rect->w;
      uVar7._4_4_ = src_rect->h;
    }
    GPU_BlitRectX(image,src_rect,target,dest_rect,0.0,(float)uVar7 * 0.5,
                  (float)((ulong)uVar7 >> 0x20) * 0.5,0);
    return;
  }
  return;
}

Assistant:

void GPU_BlitRect(GPU_Image* image, GPU_Rect* src_rect, GPU_Target* target, GPU_Rect* dest_rect)
{
    float w = 0.0f;
    float h = 0.0f;
    
    if(image == NULL)
        return;
    
    if(src_rect == NULL)
    {
        w = image->w;
        h = image->h;
    }
    else
    {
        w = src_rect->w;
        h = src_rect->h;
    }
    
    GPU_BlitRectX(image, src_rect, target, dest_rect, 0.0f, w*0.5f, h*0.5f, GPU_FLIP_NONE);
}